

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O3

bool __thiscall QFSFileEngine::setFileTime(QFSFileEngine *this,QDateTime *newDate,FileTime time)

{
  byte *pbVar1;
  QAbstractFileEnginePrivate *pQVar2;
  FILE *__stream;
  bool bVar3;
  int fd;
  long in_FS_OFFSET;
  QSystemError local_48;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->super_QAbstractFileEngine).d_ptr.d;
  if (pQVar2[2].fileError == NoError) {
    qt_error_string(&local_40,0xd);
    QAbstractFileEngine::setError(&this->super_QAbstractFileEngine,PermissionsError,&local_40);
    setFileTime((QFSFileEngine *)&local_40);
    bVar3 = false;
  }
  else {
    local_48.errorCode = 0;
    local_48.errorScope = NoError;
    __stream = (FILE *)pQVar2[3].errorString.d.ptr;
    if (__stream == (FILE *)0x0) {
      fd = *(int *)&pQVar2[3].q_ptr;
    }
    else {
      fd = fileno(__stream);
    }
    bVar3 = QFileSystemEngine::setFileTime(fd,newDate,time,&local_48);
    if (bVar3) {
      pbVar1 = (byte *)((long)&pQVar2[2].errorString.d.d + 3);
      *pbVar1 = *pbVar1 & 0xfd;
    }
    else {
      QSystemError::string(&local_40,local_48.errorScope,local_48.errorCode);
      QAbstractFileEngine::setError(&this->super_QAbstractFileEngine,PermissionsError,&local_40);
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngine::setFileTime(const QDateTime &newDate, QFile::FileTime time)
{
    Q_D(QFSFileEngine);

    if (d->openMode == QIODevice::NotOpen) {
        setError(QFile::PermissionsError, qt_error_string(EACCES));
        return false;
    }

    QSystemError error;
    if (!QFileSystemEngine::setFileTime(d->nativeHandle(), newDate, time, error)) {
        setError(QFile::PermissionsError, error.toString());
        return false;
    }

    d->metaData.clearFlags(QFileSystemMetaData::Times);
    return true;
}